

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilters.cpp
# Opt level: O2

void __thiscall
chrono::utils::ChISO2631_Vibration_SeatCushionLogger::GeneratePlotFile
          (ChISO2631_Vibration_SeatCushionLogger *this,string *fName,string *testInfo)

{
  undefined1 auVar1 [16];
  char cVar2;
  ostream *poVar3;
  size_t i;
  ulong uVar4;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qb;
  ofstream plt;
  undefined1 auVar5 [16];
  
  std::ofstream::ofstream(&plt,(string *)fName,_S_out);
  cVar2 = std::__basic_file<char>::is_open();
  auVar5._8_8_ = extraout_XMM1_Qb;
  auVar5._0_8_ = extraout_XMM1_Qa;
  if (cVar2 == '\0') {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "ChISO2631_SeatCushionLogger: Connot generate file \'");
    poVar3 = std::operator<<(poVar3,(string *)fName);
    poVar3 = std::operator<<(poVar3,"\', bailing out!");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  else {
    poVar3 = std::operator<<((ostream *)&plt,"$ALLDATA << EOD");
    std::endl<char,std::char_traits<char>>(poVar3);
    for (uVar4 = 0;
        uVar4 < (ulong)((long)(this->m_data_acc_x).
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)(this->m_data_acc_x).
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start >> 3); uVar4 = uVar4 + 1) {
      auVar1 = vcvtusi2sd_avx512f(auVar5,uVar4);
      poVar3 = std::ostream::_M_insert<double>(auVar1._0_8_ * this->m_step);
      std::operator<<(poVar3,"\t");
      poVar3 = std::ostream::_M_insert<double>
                         ((this->m_data_acc_x).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar4]);
      std::operator<<(poVar3,"\t");
      poVar3 = std::ostream::_M_insert<double>
                         ((this->m_data_acc_y).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar4]);
      std::operator<<(poVar3,"\t");
      poVar3 = std::ostream::_M_insert<double>
                         ((this->m_data_acc_z).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar4]);
      std::operator<<(poVar3,"\t");
      poVar3 = std::ostream::_M_insert<double>
                         ((this->m_data_acc_x_wd).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar4]);
      std::operator<<(poVar3,"\t");
      poVar3 = std::ostream::_M_insert<double>
                         ((this->m_data_acc_y_wd).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar4]);
      std::operator<<(poVar3,"\t");
      poVar3 = std::ostream::_M_insert<double>
                         ((this->m_data_acc_z_wk).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar4]);
      std::operator<<(poVar3,"\t");
      poVar3 = std::ostream::_M_insert<double>
                         ((this->m_data_aw_x_i).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar4]);
      std::operator<<(poVar3,"\t");
      poVar3 = std::ostream::_M_insert<double>
                         ((this->m_data_aw_y_i).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar4]);
      std::operator<<(poVar3,"\t");
      poVar3 = std::ostream::_M_insert<double>
                         ((this->m_data_aw_z_i).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar4]);
      std::operator<<(poVar3,"\t");
      poVar3 = std::ostream::_M_insert<double>
                         ((this->m_data_aw_x_avg).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar4]);
      std::operator<<(poVar3,"\t");
      poVar3 = std::ostream::_M_insert<double>
                         ((this->m_data_aw_y_avg).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar4]);
      std::operator<<(poVar3,"\t");
      poVar3 = std::ostream::_M_insert<double>
                         ((this->m_data_aw_z_avg).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar4]);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    poVar3 = std::operator<<((ostream *)&plt,"EOD");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&plt,"set title \'ISO2631 Vibration Test: ");
    poVar3 = std::operator<<(poVar3,(string *)testInfo);
    poVar3 = std::operator<<(poVar3,"\'");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&plt,"set xlabel \'Time [s]\'");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&plt,"set ylabel \'A [m/s^2]\'");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&plt,"plot $ALLDATA u 1:2  t \'Ax\' with lines, \\");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&plt,"     $ALLDATA u 1:3  t \'Ay\' with lines, \\");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&plt,"     $ALLDATA u 1:4  t \'Az\' with lines");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&plt,"pause -1");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&plt,"set title \'ISO2631 Vibration Test: ");
    poVar3 = std::operator<<(poVar3,(string *)testInfo);
    poVar3 = std::operator<<(poVar3,"\'");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&plt,"set xlabel \'Time [s]\'");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&plt,"set ylabel \'AW [m/s^2]\'");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&plt,"plot $ALLDATA u 1:5  t \'AWx\' with lines, \\");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&plt,"     $ALLDATA u 1:6  t \'AWy\' with lines, \\");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&plt,"     $ALLDATA u 1:7  t \'AWz\' with lines");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&plt,"pause -1");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&plt,"set title \'ISO2631 Vibration Test: ");
    poVar3 = std::operator<<(poVar3,(string *)testInfo);
    poVar3 = std::operator<<(poVar3,"\'");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&plt,"set xlabel \'Time [s]\'");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&plt,"set ylabel \'AWi [m/s^2]\'");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&plt,"plot $ALLDATA u 1:8  t \'AWxi\' with lines, \\");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&plt,"     $ALLDATA u 1:9  t \'AWyi\' with lines, \\");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&plt,"     $ALLDATA u 1:10  t \'AWzi\' with lines");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&plt,"pause -1");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&plt,"set title \'ISO2631 Vibration Test: ");
    poVar3 = std::operator<<(poVar3,(string *)testInfo);
    poVar3 = std::operator<<(poVar3,"\'");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&plt,"set xlabel \'Time [s]\'");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&plt,"set ylabel \'AWavg [m/s^2]\'");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&plt,"plot $ALLDATA u 1:11  t \'AWxavg\' with lines, \\");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&plt,"     $ALLDATA u 1:12  t \'AWyavg\' with lines, \\");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&plt,"     $ALLDATA u 1:13  t \'AWzavz\' with lines");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::ofstream::close();
  }
  std::ofstream::~ofstream(&plt);
  return;
}

Assistant:

void ChISO2631_Vibration_SeatCushionLogger::GeneratePlotFile(std::string fName, std::string testInfo) {
    std::ofstream plt(fName);
    if (!plt.is_open()) {
        std::cout << "ChISO2631_SeatCushionLogger: Connot generate file '" << fName << "', bailing out!" << std::endl;
        return;
    }
    plt << "$ALLDATA << EOD" << std::endl;
    for (size_t i = 0; i < m_data_acc_x.size(); i++) {
        double t = m_step * i;
        plt << t << "\t" << m_data_acc_x[i] << "\t" << m_data_acc_y[i] << "\t" << m_data_acc_z[i] << "\t"
            << m_data_acc_x_wd[i] << "\t" << m_data_acc_y_wd[i] << "\t" << m_data_acc_z_wk[i] << "\t"
            << m_data_aw_x_i[i] << "\t" << m_data_aw_y_i[i] << "\t" << m_data_aw_z_i[i] << "\t" << m_data_aw_x_avg[i]
            << "\t" << m_data_aw_y_avg[i] << "\t" << m_data_aw_z_avg[i] << std::endl;
    }
    plt << "EOD" << std::endl;
    plt << "set title 'ISO2631 Vibration Test: " << testInfo << "'" << std::endl;
    plt << "set xlabel 'Time [s]'" << std::endl;
    plt << "set ylabel 'A [m/s^2]'" << std::endl;
    plt << "plot $ALLDATA u 1:2  t 'Ax' with lines, \\" << std::endl;
    plt << "     $ALLDATA u 1:3  t 'Ay' with lines, \\" << std::endl;
    plt << "     $ALLDATA u 1:4  t 'Az' with lines" << std::endl;
    plt << "pause -1" << std::endl;
    plt << "set title 'ISO2631 Vibration Test: " << testInfo << "'" << std::endl;
    plt << "set xlabel 'Time [s]'" << std::endl;
    plt << "set ylabel 'AW [m/s^2]'" << std::endl;
    plt << "plot $ALLDATA u 1:5  t 'AWx' with lines, \\" << std::endl;
    plt << "     $ALLDATA u 1:6  t 'AWy' with lines, \\" << std::endl;
    plt << "     $ALLDATA u 1:7  t 'AWz' with lines" << std::endl;
    plt << "pause -1" << std::endl;
    plt << "set title 'ISO2631 Vibration Test: " << testInfo << "'" << std::endl;
    plt << "set xlabel 'Time [s]'" << std::endl;
    plt << "set ylabel 'AWi [m/s^2]'" << std::endl;
    plt << "plot $ALLDATA u 1:8  t 'AWxi' with lines, \\" << std::endl;
    plt << "     $ALLDATA u 1:9  t 'AWyi' with lines, \\" << std::endl;
    plt << "     $ALLDATA u 1:10  t 'AWzi' with lines" << std::endl;
    plt << "pause -1" << std::endl;
    plt << "set title 'ISO2631 Vibration Test: " << testInfo << "'" << std::endl;
    plt << "set xlabel 'Time [s]'" << std::endl;
    plt << "set ylabel 'AWavg [m/s^2]'" << std::endl;
    plt << "plot $ALLDATA u 1:11  t 'AWxavg' with lines, \\" << std::endl;
    plt << "     $ALLDATA u 1:12  t 'AWyavg' with lines, \\" << std::endl;
    plt << "     $ALLDATA u 1:13  t 'AWzavz' with lines" << std::endl;
    plt.close();
}